

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.cpp
# Opt level: O3

int __thiscall zmq::pair_t::xsend(pair_t *this,msg_t *msg_)

{
  byte bVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  size_t in_RCX;
  void *in_RDX;
  EVP_PKEY_CTX *ctx;
  
  if ((this->_pipe == (pipe_t *)0x0) ||
     (ctx = (EVP_PKEY_CTX *)msg_, sVar3 = pipe_t::write(this->_pipe,(int)msg_,in_RDX,in_RCX),
     (char)sVar3 == '\0')) {
    piVar4 = __errno_location();
    *piVar4 = 0xb;
    return -1;
  }
  bVar1 = msg_t::flags(msg_);
  if ((bVar1 & 1) == 0) {
    pipe_t::flush(this->_pipe);
  }
  iVar2 = msg_t::init(msg_,ctx);
  if (iVar2 == 0) {
    return 0;
  }
  xsend();
  return 0;
}

Assistant:

int zmq::pair_t::xsend (msg_t *msg_)
{
    if (!_pipe || !_pipe->write (msg_)) {
        errno = EAGAIN;
        return -1;
    }

    if (!(msg_->flags () & msg_t::more))
        _pipe->flush ();

    //  Detach the original message from the data buffer.
    const int rc = msg_->init ();
    errno_assert (rc == 0);

    return 0;
}